

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(fmt::v8::basic_string_view<char>)::__0>
          (detail *this,string_view s,anon_class_8_1_8991fb9c_for_f f)

{
  size_t sVar1;
  char *pcVar2;
  char *end_1;
  char *buf_ptr;
  char *pcStack_48;
  char buf [7];
  long num_chars_left;
  char *end;
  size_t block_size;
  char *p;
  anon_class_8_1_54a39806 decode;
  anon_class_8_1_8991fb9c_for_f f_local;
  string_view s_local;
  
  p = (char *)s.size_;
  decode.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)p;
  f_local.this = (utf8_to_utf16 *)this;
  block_size = (size_t)basic_string_view<char>::data((basic_string_view<char> *)&f_local);
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
  if (sVar1 < 4) {
LAB_00172f86:
    pcVar2 = basic_string_view<char>::data((basic_string_view<char> *)&f_local);
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
    pcStack_48 = pcVar2 + (sVar1 - block_size);
    if (pcStack_48 != (char *)0x0) {
      memset((void *)((long)&buf_ptr + 1),0,7);
      copy_str<char,_const_char,_char,_0>
                ((char *)block_size,pcStack_48 + block_size,(char *)((long)&buf_ptr + 1));
      end_1 = (char *)((long)&buf_ptr + 1);
      do {
        pcVar2 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h:2548:25)>
                 ::anon_class_8_1_54a39806::operator()
                           ((anon_class_8_1_54a39806 *)&p,end_1,(char *)block_size);
        if (pcVar2 == (char *)0x0) {
          return;
        }
        block_size = (size_t)(pcVar2 + (block_size - (long)end_1));
        end_1 = pcVar2;
      } while ((long)pcVar2 - ((long)&buf_ptr + 1) < (long)pcStack_48);
    }
  }
  else {
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
    pcVar2 = (char *)(block_size + (sVar1 - 3));
    do {
      if (pcVar2 <= block_size) goto LAB_00172f86;
      block_size = (size_t)for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h:2548:25)>
                           ::anon_class_8_1_54a39806::operator()
                                     ((anon_class_8_1_54a39806 *)&p,(char *)block_size,
                                      (char *)block_size);
    } while ((char *)block_size != (char *)0x0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, to_unsigned(end - buf_ptr)));
    return result ? end : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}